

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::save_magick
          (CImg<unsigned_char> *this,char *filename,uint bytes_per_pixel)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  bool bVar6;
  CImgArgumentException *this_00;
  char *pcVar7;
  char *pcVar8;
  CImgInstanceException *this_01;
  CImgIOException *this_02;
  long in_RSI;
  CImg<unsigned_char> *in_RDI;
  uint local_1c;
  long local_18;
  
  if (in_RSI == 0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    uVar1 = in_RDI->_width;
    uVar2 = in_RDI->_height;
    uVar3 = in_RDI->_depth;
    uVar4 = in_RDI->_spectrum;
    puVar5 = in_RDI->_data;
    pcVar7 = "non-";
    if ((in_RDI->_is_shared & 1U) != 0) {
      pcVar7 = "";
    }
    pcVar8 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_magick() : Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  local_18 = in_RSI;
  bVar6 = is_empty(in_RDI);
  if (!bVar6) {
    cimg::unused<unsigned_int>(&local_1c);
    this_02 = (CImgIOException *)__cxa_allocate_exception(0x4008);
    uVar1 = in_RDI->_width;
    uVar2 = in_RDI->_height;
    uVar3 = in_RDI->_depth;
    uVar4 = in_RDI->_spectrum;
    puVar5 = in_RDI->_data;
    pcVar7 = "non-";
    if ((in_RDI->_is_shared & 1U) != 0) {
      pcVar7 = "";
    }
    pcVar8 = pixel_type();
    CImgIOException::CImgIOException
              (this_02,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_magick() : Unable to save file \'%s\' unless libMagick++ is enabled."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8,local_18);
    __cxa_throw(this_02,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
  }
  this_01 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  uVar1 = in_RDI->_width;
  uVar2 = in_RDI->_height;
  uVar3 = in_RDI->_depth;
  uVar4 = in_RDI->_spectrum;
  puVar5 = in_RDI->_data;
  pcVar7 = "non-";
  if ((in_RDI->_is_shared & 1U) != 0) {
    pcVar7 = "";
  }
  pcVar8 = pixel_type();
  CImgInstanceException::CImgInstanceException
            (this_01,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_magick() : Empty instance, for file \'%s\'."
             ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8,local_18);
  __cxa_throw(this_01,&CImgInstanceException::typeinfo,CImgInstanceException::~CImgInstanceException
             );
}

Assistant:

const CImg<T>& save_magick(const char *const filename, const unsigned int bytes_per_pixel=0) const {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "save_magick() : Specified filename is (null).",
                                    cimg_instance);
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "save_magick() : Empty instance, for file '%s'.",
                                    cimg_instance,
                                    filename);
#ifdef cimg_use_magick
      double stmin, stmax = (double)max_min(stmin);
      if (_depth>1)
        cimg::warn(_cimg_instance
                   "save_magick() : Instance is volumetric, only the first slice will be saved in file '%s'.",
                   cimg_instance,
                   filename);

      if (_spectrum>3)
        cimg::warn(_cimg_instance
                   "save_magick() : Instance is multispectral, only the three first channels will be saved in file '%s'.",
                   cimg_instance,
                   filename);

      if (stmin<0 || (bytes_per_pixel==1 && stmax>=256) || stmax>=65536)
        cimg::warn(_cimg_instance
                   "save_magick() : Instance has pixel values in [%g,%g], probable type overflow in file '%s'.",
                   cimg_instance,
                   filename,stmin,stmax);

      Magick::Image image(Magick::Geometry(_width,_height),"black");
      image.type(Magick::TrueColorType);
      image.depth(bytes_per_pixel?(8*bytes_per_pixel):(stmax>=256?16:8));
      const T
        *ptr_r = data(0,0,0,0),
        *ptr_g = _spectrum>1?data(0,0,0,1):0,
        *ptr_b = _spectrum>2?data(0,0,0,2):0;
      Magick::PixelPacket *pixels = image.getPixels(0,0,_width,_height);
      switch (_spectrum) {
      case 1 : // Scalar images
        for (unsigned int off = _width*_height; off; --off) {
          pixels->red = pixels->green = pixels->blue = (Magick::Quantum)*(ptr_r++);
          ++pixels;
        }
        break;
      case 2 : // RG images
        for (unsigned int off = _width*_height; off; --off) {
          pixels->red = (Magick::Quantum)*(ptr_r++);
          pixels->green = (Magick::Quantum)*(ptr_g++);
          pixels->blue = 0; ++pixels;
        }
        break;
      default : // RGB images
        for (unsigned int off = _width*_height; off; --off) {
          pixels->red = (Magick::Quantum)*(ptr_r++);
          pixels->green = (Magick::Quantum)*(ptr_g++);
          pixels->blue = (Magick::Quantum)*(ptr_b++);
          ++pixels;
        }
      }
      image.syncPixels();
      image.write(filename);
#else
      cimg::unused(bytes_per_pixel);
      throw CImgIOException(_cimg_instance
                            "save_magick() : Unable to save file '%s' unless libMagick++ is enabled.",
                            cimg_instance,
                            filename);
#endif
      return *this;
    }